

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O2

void LEARNER::generic_driver(vector<vw_*,_std::allocator<vw_*>_> *alls)

{
  vw *all;
  pointer ppvVar1;
  _Vector_base<vw_*,_std::allocator<vw_*>_> local_30;
  
  all = *(alls->super__Vector_base<vw_*,_std::allocator<vw_*>_>)._M_impl.super__Vector_impl_data.
         _M_start;
  std::vector<vw_*,_std::allocator<vw_*>_>::vector
            ((vector<vw_*,_std::allocator<vw_*>_> *)&local_30,alls);
  generic_driver<std::vector<vw_*,_std::allocator<vw_*>_>,_&LEARNER::process_multiple>
            (all,(vector<vw_*,_std::allocator<vw_*>_> *)&local_30);
  std::_Vector_base<vw_*,_std::allocator<vw_*>_>::~_Vector_base(&local_30);
  ppvVar1 = (alls->super__Vector_base<vw_*,_std::allocator<vw_*>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  while (ppvVar1 = ppvVar1 + 1,
        ppvVar1 !=
        (alls->super__Vector_base<vw_*,_std::allocator<vw_*>_>)._M_impl.super__Vector_impl_data.
        _M_finish) {
    learner<char,_char>::end_examples((*ppvVar1)->l);
  }
  return;
}

Assistant:

void generic_driver(vector<vw*> alls)
{
  generic_driver<vector<vw*>, process_multiple>(**alls.begin(), alls);

  // skip first as it already called end_examples()
  auto it = alls.begin();
  for (it++; it != alls.end(); it++) (*it)->l->end_examples();
}